

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O2

void envydis(disisa *isa,FILE *out,uint8_t *code,uint32_t start,int num,varinfo *varinfo,int quiet,
            label *labels,int labelsnum,envy_colors *cols)

{
  char **ppcVar1;
  char **ppcVar2;
  label *plVar3;
  ulong *puVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  dis_status dVar13;
  int *__ptr;
  char **__ptr_00;
  dis_res *pdVar14;
  char **ppcVar15;
  envy_colors *peVar16;
  char **ppcVar17;
  ulong uVar18;
  long lVar19;
  char *pcVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  byte *pbVar24;
  uint32_t uVar25;
  char *pcVar26;
  char *__format;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  size_t __nmemb;
  bool bVar32;
  decoctx local_70;
  
  local_70.labelsnum = 0;
  local_70.labelsmax = 0;
  __nmemb = (size_t)num;
  local_70.code = code;
  local_70.codesz = num;
  __ptr = (int *)calloc(__nmemb,4);
  local_70.marks = __ptr;
  __ptr_00 = (char **)calloc(__nmemb,8);
  local_70.labels = labels;
  local_70.labelsnum = labelsnum;
  local_70.isa = isa;
  local_70.varinfo = varinfo;
  local_70.names = __ptr_00;
  local_70.codebase = start;
  uVar8 = ed_getcstride(isa,varinfo);
  uVar9 = ed_getcbsz(isa,varinfo);
  if (labels == (label *)0x0) {
    for (uVar11 = 0; (int)uVar11 < num; uVar11 = uVar11 + uVar25 + (uint)(uVar25 == 0)) {
      pdVar14 = do_dis(&local_70,uVar11);
      dis_dopp(&local_70,pdVar14,(ulong)(uVar11 + start));
      uVar25 = pdVar14->oplen;
      dis_del_res(pdVar14);
    }
  }
  else {
    uVar10 = start + num;
    uVar18 = 0;
    uVar22 = (ulong)(uint)labelsnum;
    if (labelsnum < 1) {
      uVar22 = uVar18;
    }
    for (; uVar18 != uVar22; uVar18 = uVar18 + 1) {
      plVar3 = labels + uVar18;
      uVar29 = labels[uVar18].val;
      uVar27 = (uint)uVar29;
      if (uVar27 < uVar10 && start <= uVar27) {
        __ptr[uVar27 - start] = __ptr[uVar27 - start] | plVar3->type;
      }
      if ((uVar29 < uVar10 && start <= uVar29) && (plVar3->name != (char *)0x0)) {
        __ptr_00[uVar29 - start] = plVar3->name;
      }
      uVar27 = plVar3->size;
      if ((ulong)uVar27 != 0) {
        for (uVar30 = 0; uVar30 < uVar27; uVar30 = uVar30 + 4) {
          uVar12 = (uint)uVar29;
          if (uVar12 < uVar10 && start <= uVar12) {
            __ptr[uVar12 - start] = __ptr[uVar12 - start] | plVar3->type;
          }
          uVar29 = (ulong)(uVar12 + 4);
        }
      }
    }
    uVar10 = 0;
    bVar7 = true;
    uVar22 = 0;
LAB_00269dae:
    do {
      bVar32 = uVar10 == 0;
      for (uVar22 = (ulong)(int)uVar22; uVar11 = (uint32_t)uVar22, (int)uVar11 < num;
          uVar22 = uVar22 + 1) {
        if (!bVar32) {
LAB_00269e0a:
          pdVar14 = do_dis(&local_70,uVar11);
          dis_dopp(&local_70,pdVar14,(ulong)(start + uVar11));
          uVar25 = pdVar14->oplen;
          if (uVar25 == 0) {
            uVar10 = 0;
          }
          else if (pdVar14->endmark == 0) {
            uVar10 = (__ptr[uVar22] & 4U) >> 2 ^ 1;
            if ((__ptr[uVar22] & 4U) != 0) {
              uVar25 = 0;
            }
            uVar22 = (ulong)(uVar11 + uVar25);
          }
          else {
            uVar10 = 0;
          }
          dis_del_res(pdVar14);
          goto LAB_00269dae;
        }
        uVar10 = __ptr[uVar22];
        if ((char)((uVar10 & 8) >> 3) == '\0' && (uVar10 & 3) != 0) {
          __ptr[uVar22] = uVar10 | 8;
          bVar7 = false;
          goto LAB_00269e0a;
        }
        bVar32 = true;
      }
      uVar10 = 0;
      uVar22 = 0;
      bVar32 = !bVar7;
      bVar7 = true;
    } while (bVar32);
  }
  ppcVar1 = &cols->ctarg;
  ppcVar2 = &cols->btarg;
  ppcVar15 = &cols->err;
  bVar32 = false;
  uVar22 = 0;
  bVar7 = false;
  uVar11 = 0;
LAB_00269f19:
  do {
    while( true ) {
      uVar10 = (uint)uVar22;
      if (num <= (int)uVar11) {
        free(__ptr);
        free(__ptr_00);
        return;
      }
      lVar23 = (long)(int)uVar11;
      uVar27 = __ptr[lVar23];
      if (__ptr_00[lVar23] == (char *)0x0) break;
      if (uVar10 != 0) {
        pcVar26 = "%s[%x bytes skipped]\n";
        peVar16 = (envy_colors *)ppcVar15;
        if (!bVar7) {
          pcVar26 = "%s[%x zero bytes skipped]\n";
          peVar16 = cols;
        }
        bVar7 = false;
        fprintf((FILE *)out,pcVar26,peVar16->reset,uVar22);
      }
      if ((uVar27 & 0x1b0) == 0) {
        if ((uVar27 & 2) == 0) {
          pcVar26 = __ptr_00[lVar23];
          peVar16 = (envy_colors *)ppcVar2;
          if ((uVar27 & 1) == 0) {
            peVar16 = cols;
          }
          pcVar20 = peVar16->reset;
          __format = "%s%s:\n";
        }
        else {
          pcVar20 = *ppcVar1;
          pcVar26 = __ptr_00[lVar23];
          __format = "\n%s%s:\n";
        }
        fprintf((FILE *)out,__format,pcVar20,pcVar26);
        if (!bVar32) {
          uVar10 = 0;
          goto LAB_0026a225;
        }
        bVar32 = true;
      }
      else {
        fprintf((FILE *)out,"%s%s:\n",cols->reset,__ptr_00[lVar23]);
        bVar6 = !bVar32;
        bVar32 = true;
        if (bVar6) goto LAB_0026a080;
      }
LAB_0026a2b4:
      pdVar14 = do_dis(&local_70,uVar11);
      uVar22 = (ulong)(uVar11 + start);
      dis_dopp(&local_70,pdVar14,uVar22);
      if ((uVar27 & 4) != 0 || pdVar14->endmark != 0) {
        bVar32 = false;
      }
      if (((uVar27 & 2) != 0) && (__ptr_00[lVar23] == (char *)0x0)) {
        fputc(10,(FILE *)out);
      }
      ppcVar17 = ppcVar2;
      switch(uVar27 & 3) {
      case 0:
        if (quiet != 0) goto LAB_0026a3c8;
        fprintf((FILE *)out,"%s%08x:%s",cols->reset,uVar22,cols->reset);
        goto LAB_0026a3e4;
      case 2:
        ppcVar17 = ppcVar1;
        break;
      case 3:
        ppcVar17 = &cols->bctarg;
      }
      fprintf((FILE *)out,"%s%08x:%s",*ppcVar17,uVar22,cols->reset);
      if (quiet == 0) {
LAB_0026a3e4:
        for (iVar28 = 0; iVar28 < isa->maxoplen; iVar28 = iVar28 + isa->opunit) {
          fputc(0x20,(FILE *)out);
          uVar10 = isa->opunit * uVar8;
          for (lVar23 = (long)(int)uVar10; uVar10 = uVar10 - 1, 0 < lVar23; lVar23 = lVar23 + -1) {
            uVar12 = uVar10 / uVar8 + iVar28;
            if ((uVar12 == 0) || (uVar12 < pdVar14->oplen)) {
              if ((int)(uVar10 / uVar8 + iVar28 + uVar11) < num) {
                fprintf((FILE *)out,"%s%02x",cols->reset,
                        (ulong)code[lVar23 + (long)(int)((iVar28 + uVar11) * uVar8) + -1]);
              }
              else {
                fprintf((FILE *)out,"%s??",cols->err);
              }
            }
            else {
              fwrite("  ",2,1,(FILE *)out);
            }
          }
        }
        fwrite("  ",2,1,(FILE *)out);
        if ((uVar27 & 2) == 0) {
          fputc(0x20,(FILE *)out);
        }
        else {
          fprintf((FILE *)out,"%sC",*ppcVar1);
        }
        if ((uVar27 & 1) == 0) {
          iVar28 = 0x20;
          fputc(0x20,(FILE *)out);
        }
        else {
          fprintf((FILE *)out,"%sB",*ppcVar2);
          iVar28 = 0x20;
        }
LAB_0026a54f:
        fputc(iVar28,(FILE *)out);
      }
      else {
LAB_0026a3c8:
        if ((quiet == 1) && (iVar28 = 10, uVar27 != 0)) goto LAB_0026a54f;
      }
      easm_print_insn(out,cols,pdVar14->insn);
      if ((pdVar14->status & DIS_STATUS_UNK_FORM) == DIS_STATUS_OK) {
        uVar25 = pdVar14->oplen;
        iVar28 = uVar25 * 8;
        for (; (int)uVar25 < 0x10; uVar25 = uVar25 + 1) {
          pdVar14->a[(int)uVar25 / 8] =
               pdVar14->a[(int)uVar25 / 8] & ~(0xffL << ((byte)iVar28 & 0x38));
          iVar28 = iVar28 + 8;
        }
        bVar6 = false;
        for (lVar23 = -0x10; lVar23 != 0; lVar23 = lVar23 + 8) {
          puVar4 = (ulong *)((long)pdVar14->m + lVar23);
          *puVar4 = *puVar4 & ~*(ulong *)((long)pdVar14->m + lVar23 + 0x10);
          if (*puVar4 != 0) {
            bVar6 = true;
          }
        }
        if (bVar6) {
          fprintf((FILE *)out," %s[unknown:",cols->err);
          for (uVar10 = 0; (uVar10 == 0 || (uVar10 < pdVar14->oplen)); uVar10 = uVar10 + isa->opunit
              ) {
            fputc(0x20,(FILE *)out);
            iVar28 = isa->opunit * uVar8;
            iVar21 = (iVar28 + uVar10 + -1) * 8;
            while (iVar31 = iVar28 + -1, 0 < iVar28) {
              if ((int)(uVar11 + uVar10 + iVar31) < num) {
                fprintf((FILE *)out,"%02llx",
                        pdVar14->a[(int)(iVar31 + uVar10) / 8] >> ((byte)iVar21 & 0x38) & 0xff);
              }
              else {
                fwrite("??",2,1,(FILE *)out);
              }
              iVar21 = iVar21 + -8;
              iVar28 = iVar31;
            }
          }
          fputc(0x5d,(FILE *)out);
        }
      }
      else {
        fprintf((FILE *)out," %s[unknown op length]%s",cols->err,cols->reset);
      }
      dVar13 = pdVar14->status;
      if ((dVar13 & DIS_STATUS_EOF) != DIS_STATUS_OK) {
        fprintf((FILE *)out," %s[incomplete]%s",cols->err,cols->reset);
        dVar13 = pdVar14->status;
      }
      if ((dVar13 & DIS_STATUS_UNK_INSN) != DIS_STATUS_OK) {
        fprintf((FILE *)out," %s[unknown instruction]%s",cols->err,cols->reset);
        dVar13 = pdVar14->status;
      }
      if ((dVar13 & DIS_STATUS_UNK_OPERAND) != DIS_STATUS_OK) {
        fprintf((FILE *)out," %s[unknown operand]%s",cols->err,cols->reset);
      }
      fprintf((FILE *)out,"%s\n",cols->reset);
      uVar11 = uVar11 + pdVar14->oplen;
      dis_del_res(pdVar14);
LAB_0026a77c:
      uVar22 = 0;
    }
    if ((!bVar32) && ((uVar27 & 0x1b0) != 0)) {
      if (uVar10 != 0) {
        pcVar26 = "%s[%x bytes skipped]\n";
        peVar16 = (envy_colors *)ppcVar15;
        if (!bVar7) {
          pcVar26 = "%s[%x zero bytes skipped]\n";
          peVar16 = cols;
        }
        bVar7 = false;
        fprintf((FILE *)out,pcVar26,peVar16->reset,uVar22);
      }
LAB_0026a080:
      if (uVar9 != 8) {
        abort();
      }
      fprintf((FILE *)out,"%s%08x:%s",cols->mem,(ulong)(uVar11 + start),cols->reset);
      if (-1 < (char)uVar27) {
        if ((uVar27 >> 8 & 1) == 0) {
          if ((uVar27 & 0x10) == 0) {
            fprintf((FILE *)out," %s\"",cols->num);
            pbVar24 = code + lVar23;
            do {
              uVar11 = uVar11 + 1;
              bVar5 = *pbVar24;
              if (bVar5 == 10) {
                pcVar26 = "\\n";
LAB_0026a149:
                fwrite(pcVar26,2,1,(FILE *)out);
              }
              else {
                if (bVar5 == 0x22) {
                  pcVar26 = "\\\"";
                  goto LAB_0026a149;
                }
                uVar10 = (uint)bVar5;
                if (uVar10 == 0x5c) {
                  pcVar26 = "\\\\";
                  goto LAB_0026a149;
                }
                if (uVar10 == 0) goto LAB_0026a7b5;
                fputc(uVar10,(FILE *)out);
              }
              pbVar24 = pbVar24 + 1;
            } while( true );
          }
          lVar19 = 0;
          uVar10 = 0;
          for (; (lVar19 != 0x20 && (lVar23 < (long)__nmemb)); lVar23 = lVar23 + 1) {
            uVar10 = uVar10 | (uint)code[lVar23] << ((byte)lVar19 & 0x1f);
            lVar19 = lVar19 + 8;
          }
          fprintf((FILE *)out," %s%08x\n",cols->num,(ulong)uVar10);
          uVar11 = uVar11 + 4;
        }
        else {
          uVar10 = (uint)code[lVar23];
          if (lVar23 + 1 < (long)__nmemb) {
            uVar10 = (uint)CONCAT11(code[lVar23 + 1],code[lVar23]);
          }
          fprintf((FILE *)out," %s%04x\n",cols->num,(ulong)uVar10);
          uVar11 = uVar11 + 2;
        }
        bVar32 = false;
        goto LAB_0026a77c;
      }
      fprintf((FILE *)out," %s%02x\n",cols->num,(ulong)code[lVar23]);
      uVar11 = uVar11 + 1;
      uVar22 = 0;
      bVar32 = false;
      goto LAB_00269f19;
    }
    bVar6 = true;
    if (bVar32) {
LAB_0026a268:
      bVar32 = bVar6;
      if (uVar10 != 0) {
        pcVar26 = "%s[%x bytes skipped]\n";
        peVar16 = (envy_colors *)ppcVar15;
        if (!bVar7) {
          pcVar26 = "%s[%x zero bytes skipped]\n";
          peVar16 = cols;
        }
        bVar7 = false;
        fprintf((FILE *)out,pcVar26,peVar16->reset,(ulong)uVar10);
      }
      goto LAB_0026a2b4;
    }
LAB_0026a225:
    uVar12 = uVar27 & 7;
    bVar6 = uVar12 != 0;
    if ((labels == (label *)0x0) || (uVar12 != 0)) goto LAB_0026a268;
    for (uVar22 = 0; uVar8 != uVar22; uVar22 = uVar22 + 1) {
      if (code[uVar22 + (long)(int)(uVar11 * uVar8)] != '\0') {
        bVar7 = true;
      }
    }
    uVar11 = uVar11 + 1;
    uVar22 = (ulong)(uVar10 + 1);
    bVar32 = false;
  } while( true );
LAB_0026a7b5:
  fwrite("\"\n",2,1,(FILE *)out);
  bVar32 = false;
  uVar22 = 0;
  goto LAB_00269f19;
}

Assistant:

void envydis (const struct disisa *isa, FILE *out, uint8_t *code, uint32_t start, int num, struct varinfo *varinfo, int quiet, struct label *labels, int labelsnum, const struct envy_colors *cols)
{
	struct decoctx c = { 0 };
	struct decoctx *ctx = &c;
	int cur = 0, i, j;
	ctx->code = code;
	ctx->codesz = num;
	ctx->marks = calloc(num, sizeof *ctx->marks);
	ctx->names = calloc(num, sizeof *ctx->names);
	ctx->codebase = start;
	ctx->varinfo = varinfo;
	ctx->isa = isa;
	ctx->labels = labels;
	ctx->labelsnum = labelsnum;
	int stride = ed_getcstride(ctx->isa, ctx->varinfo);
	int cbsz = ed_getcbsz(ctx->isa, ctx->varinfo);
	if (labels) {
		for (i = 0; i < labelsnum; i++) {
			mark(ctx, labels[i].val, labels[i].type);
			if (labels[i].val >= ctx->codebase && labels[i].val < ctx->codebase + ctx->codesz) {
				if (labels[i].name)
					ctx->names[labels[i].val - ctx->codebase] = labels[i].name;
			}
			if (labels[i].size) {
				for (j = 0; j < labels[i].size; j+=4)
					mark(ctx, labels[i].val + j, labels[i].type);
			}
		}
		int done;
		do {
			done = 1;
			cur = 0;
			int active = 0;
			while (cur < num) {
				if (!active && (ctx->marks[cur] & 3) && !(ctx->marks[cur] & 8)) {
					done = 0;
					active = 1;
					ctx->marks[cur] |= 8;
				}
				if (active) {
					struct dis_res *dres = do_dis(ctx, cur);
					dis_dopp(ctx, dres, cur + start);
					if (dres->oplen && !dres->endmark && !(ctx->marks[cur] & 4))
						cur += dres->oplen;
					else
						active = 0;
					dis_del_res(dres);
				} else {
					cur++;
				}
			}
		} while (!done);
	} else {
		while (cur < num) {
			struct dis_res *dres = do_dis(ctx, cur);
			dis_dopp(ctx, dres, cur + start);
			if (dres->oplen)
				cur += dres->oplen;
			else
				cur++;
			dis_del_res(dres);
		}
	}
	cur = 0;
	int active = 0;
	int skip = 0, nonzero = 0;
	while (cur < num) {
		int mark = ctx->marks[cur];
		if (ctx->names[cur]) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
				skip = 0;
				nonzero = 0;
			}
			if (mark & 0x1b0)
				fprintf (out, "%s%s:\n", cols->reset, ctx->names[cur]);
			else if (mark & 2)
				fprintf (out, "\n%s%s:\n", cols->ctarg, ctx->names[cur]);
			else if (mark & 1)
				fprintf (out, "%s%s:\n", cols->btarg, ctx->names[cur]);
			else
				fprintf (out, "%s%s:\n", cols->reset, ctx->names[cur]);
		}
		if (mark & 0x1b0 && !active) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
				skip = 0;
				nonzero = 0;
			}
			if (cbsz != 8)
				abort();
			fprintf (out, "%s%08x:%s", cols->mem, cur + start, cols->reset);
			if (mark & 0x80) {
				uint8_t val = code[cur];
				fprintf (out, " %s%02x\n", cols->num, val);
				cur += 1;
			} else if (mark & 0x100) {
				uint16_t val = 0;
				for (i = 0; i < 2 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%04x\n", cols->num, val);
				cur += 2;
			} else if (mark & 0x10) {
				uint32_t val = 0;
				for (i = 0; i < 4 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%08x\n", cols->num, val);
				cur += 4;
			} else {
				fprintf (out, " %s\"", cols->num);
				while (code[cur]) {
					switch (code[cur]) {
						case '\n':
							fprintf (out, "\\n");
							break;
						case '\\':
							fprintf (out, "\\\\");
							break;
						case '\"':
							fprintf (out, "\\\"");
							break;
						default:
							fprintf (out, "%c", code[cur]);
							break;
					}
					cur++;
				}
				cur++;
				fprintf (out, "\"\n");
			}
			continue;
		}
		if (!active && mark & 7)
			active = 1;
		if (!active && labels) {
			for (i = 0; i < stride; i++)
				if (code[cur*stride+i])
					nonzero = 1;
			cur++;
			skip++;
			continue;
		}
		if (skip) {
			if (nonzero)
				fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
			else
				fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
			skip = 0;
			nonzero = 0;
		}
		struct dis_res *dres = do_dis(ctx, cur);
		dis_dopp(ctx, dres, cur + start);

		if (dres->endmark || mark & 4)
			active = 0;

		if (mark & 2 && !ctx->names[cur])
			fprintf (out, "\n");
		switch (mark & 3) {
			case 0:
				if (!quiet)
					fprintf (out, "%s%08x:%s", cols->reset, cur + start, cols->reset);
				break;
			case 1:
				fprintf (out, "%s%08x:%s", cols->btarg, cur + start, cols->reset);
				break;
			case 2:
				fprintf (out, "%s%08x:%s", cols->ctarg, cur + start, cols->reset);
				break;
			case 3:
				fprintf (out, "%s%08x:%s", cols->bctarg, cur + start, cols->reset);
				break;
		}

		if (!quiet) {
			for (i = 0; i < isa->maxoplen; i += isa->opunit) {
				fprintf (out, " ");
				for (j = isa->opunit*stride - 1; j >= 0; j--)
					if (i+j/stride && i+j/stride >= dres->oplen) {
						fprintf (out, "  ");
					} else if (cur+i+j/stride >= num) {
						fprintf (out, "%s??", cols->err);
					} else {
						fprintf (out, "%s%02x", cols->reset, code[(cur + i)*stride + j]);
					}
			}
			fprintf (out, "  ");

			if (mark & 2)
				fprintf (out, "%sC", cols->ctarg);
			else
				fprintf (out, " ");
			if (mark & 1)
				fprintf (out, "%sB", cols->btarg);
			else
				fprintf (out, " ");
			fprintf(out, " ");
		} else if (quiet == 1) {
			if (mark)
				fprintf (out, "\n");
		}

		easm_print_insn(out, cols, dres->insn);

		if (dres->status & DIS_STATUS_UNK_FORM) {
			fprintf (out, " %s[unknown op length]%s", cols->err, cols->reset);
		} else {
			int fl = 0;
			for (i = dres->oplen; i < MAXOPLEN * 8; i++)
				dres->a[i/8] &= ~(0xffull << (i & 7) * 8);
			for (i = 0; i < MAXOPLEN; i++) {
				dres->a[i] &= ~dres->m[i];
				if (dres->a[i])
					fl = 1;
			}
			if (fl) {
				fprintf (out, " %s[unknown:", cols->err);
				for (i = 0; i < dres->oplen || i == 0; i += isa->opunit) {
					fprintf (out, " ");
					for (j = isa->opunit*stride - 1; j >= 0; j--)
						if (cur+i+j >= num)
							fprintf (out, "??");
						else
							fprintf (out, "%02llx", (dres->a[(i+j)/8] >> ((i + j)&7) * 8) & 0xff);
				}
				fprintf (out, "]");
			}
		}
		if (dres->status & DIS_STATUS_EOF) {
			fprintf (out, " %s[incomplete]%s", cols->err, cols->reset);
		}
		if (dres->status & DIS_STATUS_UNK_INSN) {
			fprintf (out, " %s[unknown instruction]%s", cols->err, cols->reset);
		}
		if (dres->status & DIS_STATUS_UNK_OPERAND) {
			fprintf (out, " %s[unknown operand]%s", cols->err, cols->reset);
		}
		fprintf (out, "%s\n", cols->reset);
		cur += dres->oplen;

		dis_del_res(dres);
	}
	free(ctx->marks);
	free(ctx->names);
}